

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::FixNewlines::expandNearParens
          (FixNewlines *this,ArgParams *params,Fodder *fodder_r)

{
  ArgParam *param;
  Fodder *fodder;
  
  param = (params->
          super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (param != (params->
               super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    fodder = argParamOpenFodder(this,param);
    ensureCleanNewline(fodder);
  }
  ensureCleanNewline(fodder_r);
  return;
}

Assistant:

void expandNearParens(ArgParams &params, Fodder &fodder_r)
    {
        if (!params.empty()) {
            ensureCleanNewline(argParamOpenFodder(params.front()));
        }
        ensureCleanNewline(fodder_r);
    }